

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,AssignStmt *stmt)

{
  Generator *pGVar1;
  AssignStmt *local_18;
  
  if ((stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_18 = stmt;
    pGVar1 = Stmt::generator_parent(&stmt->super_Stmt);
    if (pGVar1->debug == true) {
      std::vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>>::
      emplace_back<kratos::Stmt*&>
                ((vector<kratos::Stmt_const*,std::allocator<kratos::Stmt_const*>> *)&this->stmts_,
                 (Stmt **)&local_18);
    }
  }
  return;
}

Assistant:

void visit(AssignStmt *stmt) override { process_stmt(stmt); }